

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

void xmlFreeRef(xmlLinkPtr lk)

{
  void *pvVar1;
  
  pvVar1 = xmlLinkGetData(lk);
  if (pvVar1 != (void *)0x0) {
    if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
      (*xmlFree)(*(void **)((long)pvVar1 + 8));
    }
    if (*(void **)((long)pvVar1 + 0x18) != (void *)0x0) {
      (*xmlFree)(*(void **)((long)pvVar1 + 0x18));
    }
    (*xmlFree)(pvVar1);
    return;
  }
  return;
}

Assistant:

static void
xmlFreeRef(xmlLinkPtr lk) {
    xmlRefPtr ref = (xmlRefPtr)xmlLinkGetData(lk);
    if (ref == NULL) return;
    if (ref->value != NULL)
        xmlFree((xmlChar *)ref->value);
    if (ref->name != NULL)
        xmlFree((xmlChar *)ref->name);
    xmlFree(ref);
}